

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

void __thiscall CConnman::SocketHandler(CConnman *this)

{
  long lVar1;
  char cVar2;
  long in_FS_OFFSET;
  Span<CNode_*const> nodes;
  _Hashtable<std::shared_ptr<const_Sock>,_std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>,_std::allocator<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>_>,_std::__detail::_Select1st,_Sock::EqualSharedPtrSock,_Sock::HashSharedPtrSock,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  _Stack_a8;
  NodesSnapshot snap;
  EventsPerSock events_per_sock;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  events_per_sock._M_h._M_buckets = &events_per_sock._M_h._M_single_bucket;
  events_per_sock._M_h._M_bucket_count = 1;
  events_per_sock._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  events_per_sock._M_h._M_element_count = 0;
  events_per_sock._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  events_per_sock._M_h._M_rehash_policy._M_next_resize = 0;
  events_per_sock._M_h._M_single_bucket = (__node_base_ptr)0x0;
  NodesSnapshot::NodesSnapshot(&snap,this,false);
  nodes.m_size = (long)snap.m_nodes_copy.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)snap.m_nodes_copy.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3;
  nodes.m_data = snap.m_nodes_copy.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
  GenerateWaitSockets((EventsPerSock *)&_Stack_a8,this,nodes);
  std::
  _Hashtable<std::shared_ptr<const_Sock>,_std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>,_std::allocator<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>_>,_std::__detail::_Select1st,_Sock::EqualSharedPtrSock,_Sock::HashSharedPtrSock,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::operator=(&events_per_sock._M_h,&_Stack_a8);
  std::
  _Hashtable<std::shared_ptr<const_Sock>,_std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>,_std::allocator<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>_>,_std::__detail::_Select1st,_Sock::EqualSharedPtrSock,_Sock::HashSharedPtrSock,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&_Stack_a8);
  if (events_per_sock._M_h._M_element_count != 0) {
    cVar2 = (*(code *)(events_per_sock._M_h._M_before_begin._M_nxt[1]._M_nxt)->_M_nxt[0xf]._M_nxt)
                      (events_per_sock._M_h._M_before_begin._M_nxt[1]._M_nxt,0x32);
    if (cVar2 != '\0') goto LAB_0017b928;
  }
  CThreadInterrupt::sleep_for(&this->interruptNet,(duration)0x2faf080);
LAB_0017b928:
  SocketHandlerConnected(this,&snap.m_nodes_copy,&events_per_sock);
  NodesSnapshot::~NodesSnapshot(&snap);
  SocketHandlerListening(this,&events_per_sock);
  std::
  _Hashtable<std::shared_ptr<const_Sock>,_std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>,_std::allocator<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>_>,_std::__detail::_Select1st,_Sock::EqualSharedPtrSock,_Sock::HashSharedPtrSock,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&events_per_sock._M_h);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CConnman::SocketHandler()
{
    AssertLockNotHeld(m_total_bytes_sent_mutex);

    Sock::EventsPerSock events_per_sock;

    {
        const NodesSnapshot snap{*this, /*shuffle=*/false};

        const auto timeout = std::chrono::milliseconds(SELECT_TIMEOUT_MILLISECONDS);

        // Check for the readiness of the already connected sockets and the
        // listening sockets in one call ("readiness" as in poll(2) or
        // select(2)). If none are ready, wait for a short while and return
        // empty sets.
        events_per_sock = GenerateWaitSockets(snap.Nodes());
        if (events_per_sock.empty() || !events_per_sock.begin()->first->WaitMany(timeout, events_per_sock)) {
            interruptNet.sleep_for(timeout);
        }

        // Service (send/receive) each of the already connected nodes.
        SocketHandlerConnected(snap.Nodes(), events_per_sock);
    }

    // Accept new connections from listening sockets.
    SocketHandlerListening(events_per_sock);
}